

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lite_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::anon_unknown_0::LiteBasicTest_AllLite23_Test::TestBody
          (LiteBasicTest_AllLite23_Test *this)

{
  undefined1 local_4c0 [8];
  TestMapLite message2;
  TestMapLite message1;
  LiteBasicTest_AllLite23_Test *this_local;
  
  proto2_unittest::TestMapLite::TestMapLite((TestMapLite *)&message2.field_0._impl_._cached_size_);
  proto2_unittest::TestMapLite::TestMapLite((TestMapLite *)local_4c0);
  MapTestUtil::SetMapFields<proto2_unittest::TestMapLite>
            ((TestMapLite *)&message2.field_0._impl_._cached_size_);
  MapTestUtil::SetMapFields<proto2_unittest::TestMapLite>((TestMapLite *)local_4c0);
  MapTestUtil::ModifyMapFields<proto2_unittest::TestMapLite>((TestMapLite *)local_4c0);
  proto2_unittest::TestMapLite::Swap
            ((TestMapLite *)&message2.field_0._impl_._cached_size_,(TestMapLite *)local_4c0);
  MapTestUtil::ExpectMapFieldsModified<proto2_unittest::TestMapLite>
            ((TestMapLite *)&message2.field_0._impl_._cached_size_);
  MapTestUtil::ExpectMapFieldsSet<proto2_unittest::TestMapLite>((TestMapLite *)local_4c0);
  proto2_unittest::TestMapLite::~TestMapLite((TestMapLite *)local_4c0);
  proto2_unittest::TestMapLite::~TestMapLite((TestMapLite *)&message2.field_0._impl_._cached_size_);
  return;
}

Assistant:

TEST(LiteBasicTest, AllLite23) {
  {
    // SwapWithOther
    proto2_unittest::TestMapLite message1, message2;

    MapTestUtil::SetMapFields(&message1);
    MapTestUtil::SetMapFields(&message2);
    MapTestUtil::ModifyMapFields(&message2);

    message1.Swap(&message2);
    MapTestUtil::ExpectMapFieldsModified(message1);
    MapTestUtil::ExpectMapFieldsSet(message2);
  }
}